

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O1

JsErrorCode JsDiagStopDebugging(JsRuntimeHandle runtimeHandle,void **callbackState)

{
  ThreadContext *threadContext;
  ProbeContainer *this;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  HRESULT hr;
  JsrtDebugManager *this_00;
  undefined4 *puVar4;
  DebugContext *pDVar5;
  void *pvVar6;
  JsrtRuntime *runtime;
  JsErrorCode JVar7;
  ScriptContext *this_01;
  AutoNestedHandledExceptionType local_68 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar7 = JsErrorInvalidArgument;
  }
  else {
    if (callbackState != (void **)0x0) {
      *callbackState = (void *)0x0;
    }
    ThreadContext::ValidateThreadContext(*runtimeHandle);
    threadContext = *runtimeHandle;
    if (threadContext->recycler != (Recycler *)0x0) {
      bVar2 = Memory::Recycler::IsHeapEnumInProgress(threadContext->recycler);
      JVar7 = JsErrorHeapEnumInProgress;
      if (bVar2) goto LAB_003b4657;
    }
    JVar7 = JsErrorInThreadServiceCallback;
    if (((threadContext->threadService).isInCallback == false) &&
       (JVar7 = JsErrorRuntimeInUse, threadContext->callRootLevel == 0)) {
      ThreadContextScope::ThreadContextScope
                ((ThreadContextScope *)&anon_var_0.m_staticAbortMessage,threadContext);
      JVar7 = JsErrorWrongThread;
      if (anon_var_0.m_staticAbortMessage._1_1_ == '\x01') {
        this_00 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
        JVar7 = JsErrorDiagNotInDebugMode;
        if ((this_00 != (JsrtDebugManager *)0x0) &&
           (bVar2 = JsrtDebugManager::IsDebugEventCallbackSet(this_00), bVar2)) {
          this_01 = *(ScriptContext **)(*runtimeHandle + 0x10e0);
          if (this_01 != (ScriptContext *)0x0) {
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            do {
              iVar3 = (*(this_01->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this_01);
              if ((char)iVar3 != '\0') break;
              bVar2 = Js::ScriptContext::IsScriptContextInDebugMode(this_01);
              if (!bVar2) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar4 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDiag.cpp"
                                   ,0x91,"(scriptContext->IsScriptContextInDebugMode())",
                                   "scriptContext->IsScriptContextInDebugMode()");
                if (!bVar2) goto LAB_003b485e;
                *puVar4 = 0;
              }
              hr = Js::ScriptContext::OnDebuggerDetached(this_01);
              if (hr < 0) {
                Debugger_AttachDetach_unrecoverable_error(hr);
                JVar7 = JsErrorFatal;
                goto LAB_003b471c;
              }
              pDVar5 = Js::ScriptContext::GetDebugContext(this_01);
              this = pDVar5->diagProbesContainer;
              Js::ProbeContainer::UninstallInlineBreakpointProbe(this,(HaltCallback *)0x0);
              Js::ProbeContainer::UninstallDebuggerScriptOptionCallback(this);
              JsrtDebugManager::ClearBreakpointDebugDocumentDictionary(this_00);
              this_01 = this_01->next;
            } while (this_01 != (ScriptContext *)0x0);
          }
          pvVar6 = JsrtDebugManager::GetAndClearCallbackState(this_00);
          JVar7 = JsNoError;
          if (callbackState != (void **)0x0) {
            *callbackState = pvVar6;
            JVar7 = JsNoError;
          }
        }
      }
LAB_003b471c:
      ThreadContextScope::~ThreadContextScope
                ((ThreadContextScope *)&anon_var_0.m_staticAbortMessage);
    }
  }
LAB_003b4657:
  if (JVar7 < JsErrorOutOfMemory) {
    if ((6 < JVar7 - JsErrorNoCurrentContext) ||
       ((0x43U >> (JVar7 - JsErrorNoCurrentContext & 0x1f) & 1) == 0)) goto LAB_003b46fb;
  }
  else if (JVar7 < JsErrorScriptTerminated) {
    if ((JVar7 != JsErrorOutOfMemory) && (JVar7 != JsErrorScriptException)) goto LAB_003b46fb;
  }
  else if ((JVar7 != JsErrorFatal) && (JVar7 != JsErrorScriptTerminated)) goto LAB_003b46fb;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                     ,0x89,
                     "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                     ,
                     "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                    );
  if (!bVar2) {
LAB_003b485e:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_003b46fb:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
  return JVar7;
}

Assistant:

CHAKRA_API JsDiagStopDebugging(
    _In_ JsRuntimeHandle runtimeHandle,
    _Out_opt_ void** callbackState)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        if (callbackState != nullptr)
        {
            *callbackState = nullptr;
        }

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
        ThreadContext * threadContext = runtime->GetThreadContext();

        VALIDATE_RUNTIME_STATE_FOR_START_STOP_DEBUGGING(threadContext);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        for (Js::ScriptContext *scriptContext = runtime->GetThreadContext()->GetScriptContextList();
        scriptContext != nullptr && !scriptContext->IsClosed();
            scriptContext = scriptContext->next)
        {
            Assert(scriptContext->IsScriptContextInDebugMode());

            HRESULT hr;
            if (FAILED(hr = scriptContext->OnDebuggerDetached()))
            {
                Debugger_AttachDetach_unrecoverable_error(hr); // Inconsistent state, we can't continue from here
                return JsErrorFatal;
            }

            Js::DebugContext* debugContext = scriptContext->GetDebugContext();

            Js::ProbeContainer* probeContainer = debugContext->GetProbeContainer();
            probeContainer->UninstallInlineBreakpointProbe(nullptr);
            probeContainer->UninstallDebuggerScriptOptionCallback();

            jsrtDebugManager->ClearBreakpointDebugDocumentDictionary();
        }

        void* cbState = jsrtDebugManager->GetAndClearCallbackState();

        if (callbackState != nullptr)
        {
            *callbackState = cbState;
        }

        return JsNoError;
    });
#endif
}